

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

key_type * __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::get_key(key_type *__return_storage_ptr__,
         hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
         *this,database *db,address addr)

{
  span<unsigned_char,__1L> sp;
  extent_type<_1L> unaff_R14;
  type uninit_buffer;
  key_type *local_38 [3];
  database_reader local_20;
  
  sp.storage_.data_ = (pointer)uninit_buffer._._0_8_;
  sp.storage_.super_extent_type<_1L>.size_ = unaff_R14.size_;
  local_20.db_ = (database *)this;
  local_20.addr_.a_ = (value_type)db;
  serialize::flood<_1l>(sp);
  serialize::archive::database_reader::get<pstore::uint128,void>(&local_20,(uint128 *)local_38);
  return local_38[0];
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::get_key (database const & db,
                                                                    address const addr) const
            -> key_type {

            return serialize::read<KeyType> (serialize::archive::database_reader{db, addr});
        }